

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O2

void ncnn::crop_pack16_avx512(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  
  iVar1 = dst->w;
  iVar2 = src->w;
  puVar11 = (undefined8 *)
            ((long)src->data + (long)(left << 4) * 4 + (long)top * (long)iVar2 * src->elemsize);
  puVar12 = (undefined8 *)dst->data;
  iVar13 = 0;
  iVar10 = iVar1;
  if (iVar1 < 1) {
    iVar10 = 0;
  }
  iVar14 = dst->h;
  if (dst->h < 1) {
    iVar14 = 0;
  }
  for (; iVar15 = iVar10, iVar13 != iVar14; iVar13 = iVar13 + 1) {
    while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
      uVar3 = puVar11[1];
      uVar4 = puVar11[2];
      uVar5 = puVar11[3];
      uVar6 = puVar11[4];
      uVar7 = puVar11[5];
      uVar8 = puVar11[6];
      uVar9 = puVar11[7];
      *puVar12 = *puVar11;
      puVar12[1] = uVar3;
      puVar12[2] = uVar4;
      puVar12[3] = uVar5;
      puVar12[4] = uVar6;
      puVar12[5] = uVar7;
      puVar12[6] = uVar8;
      puVar12[7] = uVar9;
      puVar11 = puVar11 + 8;
      puVar12 = puVar12 + 8;
    }
    puVar11 = (undefined8 *)((long)puVar11 + (long)((iVar2 - iVar1) * 0x10) * 4);
  }
  return;
}

Assistant:

static void crop_pack16_avx512(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 16;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }

        ptr += (left + right) * 16;
    }
}